

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O3

void __thiscall
leveldb::log::LogTest_MarginalTrailer2_Test::~LogTest_MarginalTrailer2_Test
          (LogTest_MarginalTrailer2_Test *this)

{
  LogTest::~LogTest(&this->super_LogTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(LogTest, MarginalTrailer2) {
  // Make a trailer that is exactly the same length as an empty record.
  const int n = kBlockSize - 2 * kHeaderSize;
  Write(BigString("foo", n));
  ASSERT_EQ(kBlockSize - kHeaderSize, WrittenBytes());
  Write("bar");
  ASSERT_EQ(BigString("foo", n), Read());
  ASSERT_EQ("bar", Read());
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ(0, DroppedBytes());
  ASSERT_EQ("", ReportMessage());
}